

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void lr_sync_read(void *lr_sync,int r,int c,int plane)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  int in_ECX;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  pthread_mutex_t *mutex;
  int nsync;
  AV1LrSync *loop_res_sync;
  
  iVar1 = *(int *)(in_RDI + 0x48);
  if ((in_ESI != 0) && ((in_EDX & iVar1 - 1U) == 0)) {
    __mutex = (pthread_mutex_t *)(*(long *)(in_RDI + (long)in_ECX * 8) + (long)(in_ESI + -1) * 0x28)
    ;
    pthread_mutex_lock(__mutex);
    while (*(int *)(*(long *)(in_RDI + 0x30 + (long)in_ECX * 8) + (long)(in_ESI + -1) * 4) - iVar1 <
           (int)in_EDX) {
      pthread_cond_wait((pthread_cond_t *)
                        (*(long *)(in_RDI + 0x18 + (long)in_ECX * 8) + (long)(in_ESI + -1) * 0x30),
                        __mutex);
    }
    pthread_mutex_unlock(__mutex);
  }
  return;
}

Assistant:

static inline void lr_sync_read(void *const lr_sync, int r, int c, int plane) {
#if CONFIG_MULTITHREAD
  AV1LrSync *const loop_res_sync = (AV1LrSync *)lr_sync;
  const int nsync = loop_res_sync->sync_range;

  if (r && !(c & (nsync - 1))) {
    pthread_mutex_t *const mutex = &loop_res_sync->mutex_[plane][r - 1];
    pthread_mutex_lock(mutex);

    while (c > loop_res_sync->cur_sb_col[plane][r - 1] - nsync) {
      pthread_cond_wait(&loop_res_sync->cond_[plane][r - 1], mutex);
    }
    pthread_mutex_unlock(mutex);
  }
#else
  (void)lr_sync;
  (void)r;
  (void)c;
  (void)plane;
#endif  // CONFIG_MULTITHREAD
}